

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void __thiscall
pugi::impl::anon_unknown_0::xml_buffered_writer::write_direct
          (xml_buffered_writer *this,char_t *data,size_t length)

{
  flush(this,this->buffer,this->bufsize);
  this->bufsize = 0;
  if (0x800 < length) {
    if (this->encoding == encoding_utf8) {
      (*this->writer->_vptr_xml_writer[2])(this->writer,data,length);
      return;
    }
    do {
      flush(this,data,0x7ff);
      data = data + 0x7ff;
      length = length - 0x7ff;
    } while (0x800 < length);
    this->bufsize = 0;
  }
  memcpy(this,data,length);
  this->bufsize = this->bufsize + length;
  return;
}

Assistant:

void write_direct(const char_t* data, size_t length)
		{
			// flush the remaining buffer contents
			flush();

			// handle large chunks
			if (length > bufcapacity)
			{
				if (encoding == get_write_native_encoding())
				{
					// fast path, can just write data chunk
					writer.write(data, length * sizeof(char_t));
					return;
				}

				// need to convert in suitable chunks
				while (length > bufcapacity)
				{
					// get chunk size by selecting such number of characters that are guaranteed to fit into scratch buffer
					// and form a complete codepoint sequence (i.e. discard start of last codepoint if necessary)
					size_t chunk_size = get_valid_length(data, bufcapacity);
					assert(chunk_size);

					// convert chunk and write
					flush(data, chunk_size);

					// iterate
					data += chunk_size;
					length -= chunk_size;
				}

				// small tail is copied below
				bufsize = 0;
			}

			memcpy(buffer + bufsize, data, length * sizeof(char_t));
			bufsize += length;
		}